

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyClient.cpp
# Opt level: O1

bool __thiscall ProxyClient::start(ProxyClient *this)

{
  UVLoop *this_00;
  function<void_()> *pfVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Head_base<0UL,_net_uv::TCPServer_*,_false> _Var3;
  Client *pCVar4;
  _Manager_type p_Var5;
  _Alloc_hider key;
  char cVar6;
  uint32_t uVar7;
  int iVar8;
  ProxyConfig *this_01;
  _Head_base<0UL,_net_uv::TCPServer_*,_false> this_02;
  Cypher *pCVar9;
  TCPClient *this_03;
  uv_loop_t *loop;
  _Manager_type *pp_Var10;
  undefined8 uVar11;
  bool bVar12;
  bool bVar13;
  string encryKey;
  string remoteIP;
  string localIP;
  string encryMethod;
  _Any_data local_118;
  undefined1 local_108 [40];
  string local_e0;
  string local_c0;
  string local_a0;
  undefined1 local_7c [4];
  string local_78;
  size_t local_58;
  string local_50;
  
  if (this->m_runStatus != STOP) {
    __assert_fail("m_runStatus == RUN_STATUS::STOP",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/ProxyClient.cpp"
                  ,0x18,"bool ProxyClient::start()");
  }
  this_01 = ProxyConfig::getInstance();
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_108 + 0x28),"");
  ProxyConfig::getString(&local_50,this_01,"encry_method",(string *)(local_108 + 0x28));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
  ProxyConfig::getString((string *)(local_108 + 0x28),this_01,"encry_key",&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
  ProxyConfig::getString(&local_a0,this_01,"client_listenIP",&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_118._M_unused._M_object = (Cypher *)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
  ProxyConfig::getString(&local_c0,this_01,"remoteIP",(string *)&local_118);
  if ((Cypher *)local_118._M_unused._0_8_ != (Cypher *)local_108) {
    operator_delete(local_118._M_unused._M_object,(ulong)(local_108._0_8_ + 1));
  }
  local_108._36_4_ = ProxyConfig::getUInt32(this_01,"client_listenPort",0);
  uVar7 = ProxyConfig::getUInt32(this_01,"svr_listenPort",0);
  local_108._32_4_ = ProxyConfig::getUInt32(this_01,"client_listenCount",0xffff);
  local_108[0x1f] = ProxyConfig::getBool(this_01,"is_ipv6",false);
  local_108[0x1e] = ProxyConfig::getBool(this_01,"use_kcp",false);
  paVar2 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  ProxyConfig::getString((string *)&local_118,this_01,"username",&local_78);
  std::__cxx11::string::operator=((string *)&this->m_username,(string *)local_118._M_pod_data);
  if ((Cypher *)local_118._M_unused._0_8_ != (Cypher *)local_108) {
    operator_delete(local_118._M_unused._M_object,(ulong)(local_108._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  ProxyConfig::getString((string *)&local_118,this_01,"password",&local_78);
  std::__cxx11::string::operator=((string *)&this->m_password,(string *)local_118._M_pod_data);
  if ((Cypher *)local_118._M_unused._0_8_ != (Cypher *)local_108) {
    operator_delete(local_118._M_unused._M_object,(ulong)(local_108._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  iVar8 = std::__cxx11::string::compare((char *)&local_50);
  if ((iVar8 != 0) || (local_e0._M_string_length != 0)) {
    bVar13 = false;
    bVar12 = false;
    if (((local_108._36_4_ == 0) ||
        (((bVar12 = bVar13, uVar7 == 0 || (local_108._32_4_ == 0)) ||
         (local_a0._M_string_length == 0)))) || (local_c0._M_string_length == 0)) goto LAB_00125f9c;
    std::__cxx11::string::_M_assign((string *)&this->m_remoteIP);
    this->m_remotePort = uVar7;
    this_02._M_head_impl = (TCPServer *)operator_new(0x758);
    net_uv::TCPServer::TCPServer(this_02._M_head_impl);
    _Var3._M_head_impl =
         (this->m_tcpSvr)._M_t.
         super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
         super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
         super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl;
    (this->m_tcpSvr)._M_t.
    super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
    super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
    super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl = this_02._M_head_impl;
    if (_Var3._M_head_impl != (TCPServer *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_Server + 8))();
    }
    _Var3._M_head_impl =
         (this->m_tcpSvr)._M_t.
         super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
         super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
         super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl;
    local_108._0_8_ = (_func_int **)0x0;
    local_108._8_8_ = (char *)0x0;
    local_118._M_unused._M_object = (void *)0x0;
    local_118._8_8_ = 0;
    local_118._M_unused._M_object = operator_new(0x18);
    *(code **)local_118._M_unused._0_8_ = on_tcp_ServerCloseCall;
    *(undefined8 *)((long)local_118._M_unused._0_8_ + 8) = 0;
    *(ProxyClient **)((long)local_118._M_unused._0_8_ + 0x10) = this;
    local_108._8_8_ =
         std::
         _Function_handler<void_(net_uv::Server_*),_std::_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>))(net_uv::Server_*)>_>
         ::_M_invoke;
    local_108._0_8_ =
         std::
         _Function_handler<void_(net_uv::Server_*),_std::_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>))(net_uv::Server_*)>_>
         ::_M_manager;
    std::function<void_(net_uv::Server_*)>::operator=
              (&((_Var3._M_head_impl)->super_Server).m_closeCall,
               (function<void_(net_uv::Server_*)> *)&local_118);
    if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
      (*(code *)local_108._0_8_)(&local_118,&local_118,3);
    }
    _Var3._M_head_impl =
         (this->m_tcpSvr)._M_t.
         super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
         super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
         super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl;
    local_108._0_8_ = (_func_int **)0x0;
    local_108._8_8_ = (char *)0x0;
    local_118._M_unused._M_object = (void *)0x0;
    local_118._8_8_ = 0;
    local_118._M_unused._M_object = operator_new(0x18);
    *(code **)local_118._M_unused._0_8_ = on_tcp_ServerNewConnectCall;
    *(undefined8 *)((long)local_118._M_unused._0_8_ + 8) = 0;
    *(ProxyClient **)((long)local_118._M_unused._0_8_ + 0x10) = this;
    local_108._8_8_ =
         std::
         _Function_handler<void_(net_uv::Server_*,_net_uv::Session_*),_std::_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(net_uv::Server_*,_net_uv::Session_*)>_>
         ::_M_invoke;
    local_108._0_8_ =
         std::
         _Function_handler<void_(net_uv::Server_*,_net_uv::Session_*),_std::_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(net_uv::Server_*,_net_uv::Session_*)>_>
         ::_M_manager;
    std::function<void_(net_uv::Server_*,_net_uv::Session_*)>::operator=
              (&((_Var3._M_head_impl)->super_Server).m_newConnectCall,
               (function<void_(net_uv::Server_*,_net_uv::Session_*)> *)&local_118);
    if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
      (*(code *)local_108._0_8_)(&local_118,&local_118,3);
    }
    _Var3._M_head_impl =
         (this->m_tcpSvr)._M_t.
         super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
         super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
         super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl;
    local_108._0_8_ = (_func_int **)0x0;
    local_108._8_8_ = (char *)0x0;
    local_118._M_unused._M_object = (void *)0x0;
    local_118._8_8_ = 0;
    local_118._M_unused._M_object = operator_new(0x18);
    *(code **)local_118._M_unused._0_8_ = on_tcp_ServerRecvCall;
    *(undefined8 *)((long)local_118._M_unused._0_8_ + 8) = 0;
    *(ProxyClient **)((long)local_118._M_unused._0_8_ + 0x10) = this;
    local_108._8_8_ =
         std::
         _Function_handler<void_(net_uv::Server_*,_net_uv::Session_*,_char_*,_unsigned_int),_std::_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(net_uv::Server_*,_net_uv::Session_*,_char_*,_unsigned_int)>_>
         ::_M_invoke;
    local_108._0_8_ =
         std::
         _Function_handler<void_(net_uv::Server_*,_net_uv::Session_*,_char_*,_unsigned_int),_std::_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(net_uv::Server_*,_net_uv::Session_*,_char_*,_unsigned_int)>_>
         ::_M_manager;
    std::function<void_(net_uv::Server_*,_net_uv::Session_*,_char_*,_unsigned_int)>::operator=
              (&((_Var3._M_head_impl)->super_Server).m_recvCall,
               (function<void_(net_uv::Server_*,_net_uv::Session_*,_char_*,_unsigned_int)> *)
               &local_118);
    if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
      (*(code *)local_108._0_8_)(&local_118,&local_118,3);
    }
    _Var3._M_head_impl =
         (this->m_tcpSvr)._M_t.
         super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
         super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
         super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl;
    local_108._0_8_ = (_func_int **)0x0;
    local_108._8_8_ = (char *)0x0;
    local_118._M_unused._M_object = (void *)0x0;
    local_118._8_8_ = 0;
    local_118._M_unused._M_object = operator_new(0x18);
    ((Cypher *)local_118._M_unused._0_8_)->_vptr_Cypher = (_func_int **)on_tcp_ServerDisconnectCall;
    ((Cypher *)local_118._M_unused._0_8_)->m_key = (char *)0x0;
    ((Cypher *)local_118._M_unused._0_8_)->m_keyLen = (size_t)this;
    local_108._8_8_ =
         std::
         _Function_handler<void_(net_uv::Server_*,_net_uv::Session_*),_std::_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(net_uv::Server_*,_net_uv::Session_*)>_>
         ::_M_invoke;
    local_108._0_8_ =
         std::
         _Function_handler<void_(net_uv::Server_*,_net_uv::Session_*),_std::_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(net_uv::Server_*,_net_uv::Session_*)>_>
         ::_M_manager;
    std::function<void_(net_uv::Server_*,_net_uv::Session_*)>::operator=
              (&((_Var3._M_head_impl)->super_Server).m_disconnectCall,
               (function<void_(net_uv::Server_*,_net_uv::Session_*)> *)&local_118);
    if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
      (*(code *)local_108._0_8_)(&local_118,&local_118,3);
    }
    _Var3._M_head_impl =
         (this->m_tcpSvr)._M_t.
         super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
         super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
         super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl;
    cVar6 = (**(code **)(*(long *)&(_Var3._M_head_impl)->super_Server + 0x30))
                      (_Var3._M_head_impl,local_a0._M_dataplus._M_p,local_108._36_4_,local_108[0x1f]
                       ,local_108._32_4_);
    if (cVar6 != '\0') {
      iVar8 = std::__cxx11::string::compare((char *)&local_50);
      key._M_p = local_e0._M_dataplus._M_p;
      if (iVar8 == 0) {
        pCVar9 = (Cypher *)operator_new(0x138);
        Cypher::Cypher(pCVar9,RC4,key._M_p,local_e0._M_string_length);
        uVar11 = (this->m_cypher)._M_t.super___uniq_ptr_impl<Cypher,_std::default_delete<Cypher>_>.
                 _M_t.super__Tuple_impl<0UL,_Cypher_*,_std::default_delete<Cypher>_>.
                 super__Head_base<0UL,_Cypher_*,_false>._M_head_impl;
        (this->m_cypher)._M_t.super___uniq_ptr_impl<Cypher,_std::default_delete<Cypher>_>._M_t.
        super__Tuple_impl<0UL,_Cypher_*,_std::default_delete<Cypher>_>.
        super__Head_base<0UL,_Cypher_*,_false>._M_head_impl = pCVar9;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar8 == 0) {
          local_7c[0] = '\x03';
          local_7c[1] = '\0';
          local_7c[2] = '\0';
          local_7c[3] = '\0';
          local_78._M_dataplus._M_p = local_e0._M_dataplus._M_p;
          local_58 = local_e0._M_string_length;
          std::make_unique<Cypher,EncryMethod,char_const*,unsigned_long>
                    ((EncryMethod *)local_118._M_pod_data,(char **)local_7c,
                     (unsigned_long *)&local_78);
        }
        else {
          local_7c[0] = '\x01';
          local_7c[1] = '\0';
          local_7c[2] = '\0';
          local_7c[3] = '\0';
          local_78._M_dataplus._M_p = local_e0._M_dataplus._M_p;
          local_58 = local_e0._M_string_length;
          std::make_unique<Cypher,EncryMethod,char_const*,unsigned_long>
                    ((EncryMethod *)local_118._M_pod_data,(char **)local_7c,
                     (unsigned_long *)&local_78);
        }
        uVar11 = local_118._M_unused._0_8_;
        local_118._M_unused._M_object = (Cypher *)0x0;
        pCVar9 = (this->m_cypher)._M_t.super___uniq_ptr_impl<Cypher,_std::default_delete<Cypher>_>.
                 _M_t.super__Tuple_impl<0UL,_Cypher_*,_std::default_delete<Cypher>_>.
                 super__Head_base<0UL,_Cypher_*,_false>._M_head_impl;
        (this->m_cypher)._M_t.super___uniq_ptr_impl<Cypher,_std::default_delete<Cypher>_>._M_t.
        super__Tuple_impl<0UL,_Cypher_*,_std::default_delete<Cypher>_>.
        super__Head_base<0UL,_Cypher_*,_false>._M_head_impl = (Cypher *)uVar11;
        uVar11 = local_118._M_unused._0_8_;
        if (pCVar9 != (Cypher *)0x0) {
          (*pCVar9->_vptr_Cypher[1])();
          uVar11 = local_118._M_unused._0_8_;
        }
      }
      if ((Cypher *)uVar11 != (Cypher *)0x0) {
        (*((Cypher *)uVar11)->_vptr_Cypher[1])();
      }
      if (local_108[0x1e] == '\0') {
        this_03 = (TCPClient *)operator_new(0x748);
        net_uv::TCPClient::TCPClient(this_03);
      }
      else {
        this_03 = (TCPClient *)operator_new(0x740);
        net_uv::KCPClient::KCPClient((KCPClient *)this_03);
      }
      pCVar4 = (this->m_pipe)._M_t.
               super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>._M_t.
               super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
               super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl;
      (this->m_pipe)._M_t.
      super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>._M_t.
      super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
      super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl = &this_03->super_Client;
      if (pCVar4 != (Client *)0x0) {
        (**(code **)((long)(pCVar4->super_Runnable)._vptr_Runnable + 8))();
      }
      local_118._M_unused._M_object = (void *)0x0;
      local_118._8_8_ = 0;
      local_108._8_8_ =
           std::
           _Function_handler<void_(net_uv::Client_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/ProxyClient.cpp:74:33)>
           ::_M_invoke;
      local_108._0_8_ =
           std::
           _Function_handler<void_(net_uv::Client_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/ProxyClient.cpp:74:33)>
           ::_M_manager;
      std::function<void_(net_uv::Client_*)>::operator=
                (&((this->m_pipe)._M_t.
                   super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>._M_t.
                   super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
                   super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl)->m_clientCloseCall,
                 (function<void_(net_uv::Client_*)> *)&local_118);
      if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
        (*(code *)local_108._0_8_)(&local_118,&local_118,3);
      }
      pCVar4 = (this->m_pipe)._M_t.
               super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>._M_t.
               super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
               super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl;
      local_108._0_8_ = (_func_int **)0x0;
      local_108._8_8_ = (char *)0x0;
      local_118._M_unused._M_object = (void *)0x0;
      local_118._8_8_ = 0;
      local_118._M_unused._M_object = operator_new(0x18);
      *(code **)local_118._M_unused._0_8_ = on_pipeConnectCallback;
      *(undefined8 *)((long)local_118._M_unused._0_8_ + 8) = 0;
      *(ProxyClient **)((long)local_118._M_unused._0_8_ + 0x10) = this;
      local_108._8_8_ =
           std::
           _Function_handler<void_(net_uv::Client_*,_net_uv::Session_*,_int),_std::_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(net_uv::Client_*,_net_uv::Session_*,_int)>_>
           ::_M_invoke;
      local_108._0_8_ =
           std::
           _Function_handler<void_(net_uv::Client_*,_net_uv::Session_*,_int),_std::_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(net_uv::Client_*,_net_uv::Session_*,_int)>_>
           ::_M_manager;
      std::function<void_(net_uv::Client_*,_net_uv::Session_*,_int)>::operator=
                (&pCVar4->m_connectCall,
                 (function<void_(net_uv::Client_*,_net_uv::Session_*,_int)> *)&local_118);
      if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
        (*(code *)local_108._0_8_)(&local_118,&local_118,3);
      }
      pCVar4 = (this->m_pipe)._M_t.
               super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>._M_t.
               super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
               super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl;
      local_108._0_8_ = (_func_int **)0x0;
      local_108._8_8_ = (char *)0x0;
      local_118._M_unused._M_object = (void *)0x0;
      local_118._8_8_ = 0;
      local_118._M_unused._M_object = operator_new(0x18);
      *(code **)local_118._M_unused._0_8_ = on_pipeDisconnectCallback;
      *(undefined8 *)((long)local_118._M_unused._0_8_ + 8) = 0;
      *(ProxyClient **)((long)local_118._M_unused._0_8_ + 0x10) = this;
      local_108._8_8_ =
           std::
           _Function_handler<void_(net_uv::Client_*,_net_uv::Session_*),_std::_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(net_uv::Client_*,_net_uv::Session_*)>_>
           ::_M_invoke;
      local_108._0_8_ =
           std::
           _Function_handler<void_(net_uv::Client_*,_net_uv::Session_*),_std::_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(net_uv::Client_*,_net_uv::Session_*)>_>
           ::_M_manager;
      std::function<void_(net_uv::Client_*,_net_uv::Session_*)>::operator=
                (&pCVar4->m_disconnectCall,
                 (function<void_(net_uv::Client_*,_net_uv::Session_*)> *)&local_118);
      if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
        (*(code *)local_108._0_8_)(&local_118,&local_118,3);
      }
      pCVar4 = (this->m_pipe)._M_t.
               super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>._M_t.
               super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
               super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl;
      local_108._0_8_ = (_func_int **)0x0;
      local_108._8_8_ = (char *)0x0;
      local_118._M_unused._M_object = (void *)0x0;
      local_118._8_8_ = 0;
      local_118._M_unused._M_object = operator_new(0x18);
      *(code **)local_118._M_unused._0_8_ = on_pipeRecvCallback;
      *(undefined8 *)((long)local_118._M_unused._0_8_ + 8) = 0;
      *(ProxyClient **)((long)local_118._M_unused._0_8_ + 0x10) = this;
      local_108._8_8_ =
           std::
           _Function_handler<void_(net_uv::Client_*,_net_uv::Session_*,_char_*,_unsigned_int),_std::_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(net_uv::Client_*,_net_uv::Session_*,_char_*,_unsigned_int)>_>
           ::_M_invoke;
      local_108._0_8_ =
           std::
           _Function_handler<void_(net_uv::Client_*,_net_uv::Session_*,_char_*,_unsigned_int),_std::_Bind<void_(ProxyClient::*(ProxyClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(net_uv::Client_*,_net_uv::Session_*,_char_*,_unsigned_int)>_>
           ::_M_manager;
      std::function<void_(net_uv::Client_*,_net_uv::Session_*,_char_*,_unsigned_int)>::operator=
                (&pCVar4->m_recvCall,
                 (function<void_(net_uv::Client_*,_net_uv::Session_*,_char_*,_unsigned_int)> *)
                 &local_118);
      if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
        (*(code *)local_108._0_8_)(&local_118,&local_118,3);
      }
      local_118._M_unused._M_object = (Cypher *)0x0;
      local_118._8_8_ = 0;
      local_108._8_8_ =
           std::
           _Function_handler<void_(net_uv::Client_*,_net_uv::Session_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/ProxyClient.cpp:78:35)>
           ::_M_invoke;
      local_108._0_8_ =
           std::
           _Function_handler<void_(net_uv::Client_*,_net_uv::Session_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/ProxyClient.cpp:78:35)>
           ::_M_manager;
      std::function<void_(net_uv::Client_*,_net_uv::Session_*)>::operator=
                (&((this->m_pipe)._M_t.
                   super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>._M_t.
                   super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
                   super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl)->m_removeSessionCall
                 ,(function<void_(net_uv::Client_*,_net_uv::Session_*)> *)&local_118);
      if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
        (*(code *)local_108._0_8_)(&local_118,&local_118,3);
      }
      this->m_runStatus = RUN;
      this_00 = &this->m_loop;
      loop = net_uv::UVLoop::ptr(this_00);
      net_uv::UVTimer::start(&this->m_update,loop,start::anon_class_1_0_00000001::__invoke,1,1,this)
      ;
      iVar8 = 0;
      net_uv::UVLoop::run(this_00,UV_RUN_DEFAULT);
      net_uv::UVLoop::close(this_00,iVar8);
      bVar12 = true;
      if ((this->m_stopCall).super__Function_base._M_manager != (_Manager_type)0x0) {
        pfVar1 = &this->m_stopCall;
        (*(this->m_stopCall)._M_invoker)((_Any_data *)pfVar1);
        pp_Var10 = &(this->m_stopCall).super__Function_base._M_manager;
        p_Var5 = *pp_Var10;
        if (p_Var5 != (_Manager_type)0x0) {
          (*p_Var5)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
          *pp_Var10 = (_Manager_type)0x0;
          (this->m_stopCall)._M_invoker = (_Invoker_type)0x0;
        }
      }
      goto LAB_00125f9c;
    }
    _Var3._M_head_impl =
         (this->m_tcpSvr)._M_t.
         super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
         super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
         super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl;
    (this->m_tcpSvr)._M_t.
    super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
    super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
    super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl = (TCPServer *)0x0;
    if (_Var3._M_head_impl != (TCPServer *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_Server + 8))();
    }
  }
  bVar12 = false;
LAB_00125f9c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar12;
}

Assistant:

bool ProxyClient::start()
{
	assert(m_runStatus == RUN_STATUS::STOP);

	auto cfg = ProxyConfig::getInstance();

	std::string encryMethod = cfg->getString("encry_method");
	std::string encryKey = cfg->getString("encry_key");
	std::string localIP = cfg->getString("client_listenIP");
	std::string remoteIP = cfg->getString("remoteIP");
	uint32_t localPort = cfg->getUInt32("client_listenPort");
	uint32_t remotePort = cfg->getUInt32("svr_listenPort");
	uint32_t listenCount = cfg->getUInt32("client_listenCount", 0xFFFF);
	bool isipv6 = cfg->getBool("is_ipv6", false);
	bool useKcp = cfg->getBool("use_kcp", false);

	m_username = cfg->getString("username");
	m_password = cfg->getString("password");

	if(encryMethod == "RC4" && encryKey.empty())
		return false;

	if(localPort == 0 || remotePort == 0 || listenCount == 0 || localIP.empty() || remoteIP.empty())
		return false;

	this->m_remoteIP = remoteIP;
	this->m_remotePort = remotePort;

	m_tcpSvr = std::make_unique<TCPServer>();
	m_tcpSvr->setCloseCallback(std::bind(&ProxyClient::on_tcp_ServerCloseCall, this, std::placeholders::_1));
	m_tcpSvr->setNewConnectCallback(std::bind(&ProxyClient::on_tcp_ServerNewConnectCall, this, std::placeholders::_1, std::placeholders::_2));
	m_tcpSvr->setRecvCallback(std::bind(&ProxyClient::on_tcp_ServerRecvCall, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3, std::placeholders::_4));
	m_tcpSvr->setDisconnectCallback(std::bind(&ProxyClient::on_tcp_ServerDisconnectCall, this, std::placeholders::_1, std::placeholders::_2));

	if (!m_tcpSvr->startServer(localIP.c_str(), localPort, isipv6, listenCount))
	{
		m_tcpSvr = NULL;
		return false;
	}

	if(encryMethod == "RC4")
		m_cypher = std::make_unique<Cypher>(EncryMethod::RC4, encryKey.c_str(), encryKey.size());
	else if(encryMethod == "SNAPPY")
		m_cypher = std::make_unique<Cypher>(EncryMethod::SNAPPY, encryKey.c_str(), encryKey.size());
	else
		m_cypher = std::make_unique<Cypher>(EncryMethod::NONE, encryKey.c_str(), encryKey.size());

	if(useKcp)
		m_pipe = std::make_unique<KCPClient>();
	else
		m_pipe = std::make_unique<TCPClient>();

	m_pipe->setClientCloseCallback([=](Client*){});
	m_pipe->setConnectCallback(std::bind(&ProxyClient::on_pipeConnectCallback, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3));
	m_pipe->setDisconnectCallback(std::bind(&ProxyClient::on_pipeDisconnectCallback, this, std::placeholders::_1, std::placeholders::_2));
	m_pipe->setRecvCallback(std::bind(&ProxyClient::on_pipeRecvCallback, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3, std::placeholders::_4));
	m_pipe->setRemoveSessionCallback([](Client*, Session* session) {});

	m_runStatus = RUN_STATUS::RUN;

	m_update.start(m_loop.ptr(), [](uv_timer_t* handle) 
	{
		auto self = (ProxyClient*)handle->data;
		self->updateFrame();
	}, 1, 1, this);
	m_loop.run(UV_RUN_DEFAULT);
	m_loop.close();

	if (m_stopCall != nullptr)
	{
		m_stopCall();
		m_stopCall = nullptr;
	}

	return true;
}